

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Inner::Set
          (Inner *this,ArenaAllocator *allocator,unsigned_long defv,int level,uint k,unsigned_long v
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Node *pNVar4;
  uint uVar5;
  
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xb6,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar5 = k >> ((byte)(level << 2) & 0x1f) & 0xf;
  pNVar4 = this->children[uVar5];
  if (pNVar4 == (Node *)0x0) {
    if (v == defv) {
      return;
    }
    pNVar4 = Node::For(allocator,level - 1U,defv);
    this->children[uVar5] = pNVar4;
  }
  (*pNVar4->_vptr_Node[1])(pNVar4,allocator,defv,(ulong)(level - 1U),(ulong)k,v);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, V defv, int level, uint k, V v) override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                {
                    if (v == defv)
                        return;
                    children[i] = Node::For(allocator, level, defv);
                }
                children[i]->Set(allocator, defv, level, k, v);
            }